

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O2

MPP_RET mpp_node_task_attach
                  (MppNodeTask *task,MppNodeImpl *node,ClusterQueue *queue,MppNodeProc *proc)

{
  (task->list_sched).next = &task->list_sched;
  (task->list_sched).prev = &task->list_sched;
  task->node = node;
  task->node_name = node->name;
  task->queue = queue;
  task->proc = proc;
  node->state = 3;
  node->attached = 1;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_node_task_attach(MppNodeTask *task, MppNodeImpl *node,
                             ClusterQueue *queue, MppNodeProc *proc)
{
    INIT_LIST_HEAD(&task->list_sched);

    task->node = node;
    task->node_name = node->name;

    task->queue = queue;
    task->proc = proc;

    node->state = NODE_VALID | NODE_IDLE;
    node->attached = 1;

    return MPP_OK;
}